

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,OPJ_BYTE *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size
                          ,opj_event_mgr_t *p_manager)

{
  size_t sVar1;
  OPJ_UINT32 *ptr;
  OPJ_UINT32 *pOVar2;
  opj_jp2_pclr_t *poVar3;
  size_t sVar4;
  ushort uVar5;
  ulong size;
  OPJ_BYTE *p_buffer;
  uint uVar6;
  OPJ_UINT32 l_value;
  uint local_5c;
  OPJ_UINT32 *local_58;
  OPJ_UINT32 *local_50;
  uint local_44;
  size_t local_40;
  int local_34;
  
  if (p_pclr_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_pclr_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x489,
                  "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x48b,
                    "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if ((2 < p_pclr_header_size) && ((jp2->color).jp2_pclr == (opj_jp2_pclr_t *)0x0)) {
      opj_read_bytes_LE(p_pclr_header_data,&local_5c,2);
      uVar6 = local_5c & 0xffff;
      if (uVar6 - 0x401 < 0xfffffc00) {
        opj_event_msg(p_manager,1,"Invalid PCLR box. Reports %d entries\n",(ulong)uVar6);
      }
      else {
        local_44 = local_5c;
        opj_read_bytes_LE(p_pclr_header_data + 2,&local_5c,1);
        size = (ulong)(ushort)local_5c;
        if (size == 0) {
          opj_event_msg(p_manager,1,"Invalid PCLR box. Reports 0 palette columns\n");
        }
        else if (((local_5c & 0xffff) + 3 <= p_pclr_header_size) &&
                (ptr = (OPJ_UINT32 *)opj_malloc((ulong)(uVar6 * (local_5c & 0xffff) * 4)),
                ptr != (OPJ_UINT32 *)0x0)) {
          local_40 = size;
          pOVar2 = (OPJ_UINT32 *)opj_malloc(size);
          if (pOVar2 != (OPJ_UINT32 *)0x0) {
            local_50 = pOVar2;
            pOVar2 = (OPJ_UINT32 *)opj_malloc(local_40);
            if (pOVar2 == (OPJ_UINT32 *)0x0) {
              opj_free(ptr);
              ptr = local_50;
            }
            else {
              local_58 = pOVar2;
              poVar3 = (opj_jp2_pclr_t *)opj_malloc(0x28);
              if (poVar3 != (opj_jp2_pclr_t *)0x0) {
                poVar3->channel_sign = (OPJ_BYTE *)local_58;
                poVar3->channel_size = (OPJ_BYTE *)local_50;
                poVar3->entries = ptr;
                poVar3->nr_entries = (OPJ_UINT16)local_44;
                poVar3->nr_channels = (byte)local_5c;
                poVar3->cmap = (opj_jp2_cmap_comp_t *)0x0;
                (jp2->color).jp2_pclr = poVar3;
                sVar1 = 0;
                do {
                  sVar4 = sVar1;
                  opj_read_bytes_LE(p_pclr_header_data + sVar4 + 3,&local_5c,1);
                  *(byte *)((long)local_50 + sVar4) = ((byte)local_5c & 0x7f) + 1;
                  *(byte *)((long)local_58 + sVar4) = (byte)local_5c >> 7;
                  sVar1 = sVar4 + 1;
                } while (local_40 != sVar4 + 1);
                if (uVar6 != 0) {
                  p_buffer = p_pclr_header_data + sVar4 + 4;
                  local_58 = (OPJ_UINT32 *)(ulong)p_pclr_header_size;
                  local_34 = 0;
                  do {
                    uVar5 = 0;
                    pOVar2 = local_50;
                    do {
                      uVar6 = (byte)*pOVar2 + 7 >> 3;
                      if (3 < uVar6) {
                        uVar6 = 4;
                      }
                      if ((long)local_58 <
                          (long)(p_buffer + ((ulong)uVar6 - (long)p_pclr_header_data))) {
                        return 0;
                      }
                      opj_read_bytes_LE(p_buffer,&local_5c,uVar6);
                      p_buffer = p_buffer + uVar6;
                      *ptr = local_5c;
                      ptr = ptr + 1;
                      uVar5 = uVar5 + 1;
                      pOVar2 = (OPJ_UINT32 *)((long)pOVar2 + 1);
                    } while (uVar5 < (ushort)local_40);
                    local_34 = local_34 + 1;
                  } while ((ushort)local_34 < (ushort)local_44);
                }
                return 1;
              }
              opj_free(ptr);
              opj_free(local_50);
              ptr = local_58;
            }
          }
          opj_free(ptr);
        }
      }
    }
    return 0;
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x48a,
                "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_pclr_header_data,
                                  OPJ_UINT32 p_pclr_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_pclr_t *jp2_pclr;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    OPJ_UINT16 nr_entries, nr_channels;
    OPJ_UINT16 i, j;
    OPJ_UINT32 l_value;
    OPJ_BYTE *orig_header_data = p_pclr_header_data;

    /* preconditions */
    assert(p_pclr_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);
    (void)p_pclr_header_size;

    if (jp2->color.jp2_pclr) {
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3) {
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 2);    /* NE */
    p_pclr_header_data += 2;
    nr_entries = (OPJ_UINT16) l_value;
    if ((nr_entries == 0U) || (nr_entries > 1024U)) {
        opj_event_msg(p_manager, EVT_ERROR, "Invalid PCLR box. Reports %d entries\n",
                      (int)nr_entries);
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* NPC */
    ++p_pclr_header_data;
    nr_channels = (OPJ_UINT16) l_value;
    if (nr_channels == 0U) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid PCLR box. Reports 0 palette columns\n");
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3 + (OPJ_UINT32)nr_channels) {
        return OPJ_FALSE;
    }

    entries = (OPJ_UINT32*) opj_malloc(sizeof(OPJ_UINT32) * nr_channels *
                                       nr_entries);
    if (!entries) {
        return OPJ_FALSE;
    }
    channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_size) {
        opj_free(entries);
        return OPJ_FALSE;
    }
    channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_sign) {
        opj_free(entries);
        opj_free(channel_size);
        return OPJ_FALSE;
    }

    jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
    if (!jp2_pclr) {
        opj_free(entries);
        opj_free(channel_size);
        opj_free(channel_sign);
        return OPJ_FALSE;
    }

    jp2_pclr->channel_sign = channel_sign;
    jp2_pclr->channel_size = channel_size;
    jp2_pclr->entries = entries;
    jp2_pclr->nr_entries = nr_entries;
    jp2_pclr->nr_channels = (OPJ_BYTE) l_value;
    jp2_pclr->cmap = NULL;

    jp2->color.jp2_pclr = jp2_pclr;

    for (i = 0; i < nr_channels; ++i) {
        opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* Bi */
        ++p_pclr_header_data;

        channel_size[i] = (OPJ_BYTE)((l_value & 0x7f) + 1);
        channel_sign[i] = (l_value & 0x80) ? 1 : 0;
    }

    for (j = 0; j < nr_entries; ++j) {
        for (i = 0; i < nr_channels; ++i) {
            OPJ_UINT32 bytes_to_read = (OPJ_UINT32)((channel_size[i] + 7) >> 3);

            if (bytes_to_read > sizeof(OPJ_UINT32)) {
                bytes_to_read = sizeof(OPJ_UINT32);
            }
            if ((ptrdiff_t)p_pclr_header_size < (ptrdiff_t)(p_pclr_header_data -
                    orig_header_data) + (ptrdiff_t)bytes_to_read) {
                return OPJ_FALSE;
            }

            opj_read_bytes(p_pclr_header_data, &l_value, bytes_to_read);    /* Cji */
            p_pclr_header_data += bytes_to_read;
            *entries = (OPJ_UINT32) l_value;
            entries++;
        }
    }

    return OPJ_TRUE;
}